

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.h
# Opt level: O2

void __thiscall
flatbuffers::VerifierTemplate<false>::VerifierTemplate
          (VerifierTemplate<false> *this,uint8_t *buf,size_t buf_len,uoffset_t max_depth,
          uoffset_t max_tables,bool check_alignment)

{
  Options local_20;
  
  local_20.check_nested_flatbuffers = true;
  local_20.max_size = 0x7fffffff;
  local_20.assert = false;
  local_20.max_depth = max_depth;
  local_20.max_tables = max_tables;
  local_20.check_alignment = check_alignment;
  VerifierTemplate(this,buf,buf_len,&local_20);
  return;
}

Assistant:

VerifierTemplate(const uint8_t *const buf, const size_t buf_len,
                   const uoffset_t max_depth = 64,
                   const uoffset_t max_tables = 1000000,
                   const bool check_alignment = true)
      : VerifierTemplate(buf, buf_len, [&] {
          Options opts;
          opts.max_depth = max_depth;
          opts.max_tables = max_tables;
          opts.check_alignment = check_alignment;
          return opts;
        }()) {}